

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# objectivec_primitive_field.cc
# Opt level: O3

void __thiscall
google::protobuf::compiler::objectivec::PrimitiveFieldGenerator::SetExtraRuntimeHasBitsBase
          (PrimitiveFieldGenerator *this,int has_base)

{
  _func_void_FieldDescriptor_ptr *buffer;
  FieldDescriptor *pFVar1;
  ObjectiveCType OVar2;
  char *pcVar3;
  mapped_type *pmVar4;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *this_00;
  FieldDescriptor *local_98 [2];
  FieldDescriptor local_88 [16];
  key_type local_78;
  undefined1 local_58 [48];
  
  pFVar1 = (this->super_SingleFieldGenerator).super_FieldGenerator.descriptor_;
  if (*(once_flag **)(pFVar1 + 0x30) != (once_flag *)0x0) {
    local_58._0_8_ = FieldDescriptor::TypeOnceInit;
    local_98[0] = pFVar1;
    std::
    call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
              (*(once_flag **)(pFVar1 + 0x30),(_func_void_FieldDescriptor_ptr **)local_58,local_98);
  }
  OVar2 = GetObjectiveCType(*(Type *)(pFVar1 + 0x38));
  if (OVar2 == OBJECTIVECTYPE_BOOLEAN) {
    buffer = (_func_void_FieldDescriptor_ptr *)(local_58 + 0x10);
    local_58._0_8_ = buffer;
    pcVar3 = FastInt32ToBufferLeft(has_base,(char *)buffer);
    local_58._8_8_ = (long)pcVar3 - (long)buffer;
    local_98[0] = local_88;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_98,local_58._0_8_,
               (_func_void_FieldDescriptor_ptr *)(local_58._0_8_ + local_58._8_8_));
    local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,"storage_offset_value","");
    this_00 = &(this->super_SingleFieldGenerator).super_FieldGenerator.variables_;
    pmVar4 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](this_00,&local_78);
    std::__cxx11::string::operator=((string *)pmVar4,(string *)local_98);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_78._M_dataplus._M_p != &local_78.field_2) {
      operator_delete(local_78._M_dataplus._M_p);
    }
    if (local_98[0] != local_88) {
      operator_delete(local_98[0]);
    }
    local_58._0_8_ = buffer;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_58,"storage_offset_comment","");
    pmVar4 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](this_00,(key_type *)local_58);
    std::__cxx11::string::_M_replace((ulong)pmVar4,0,(char *)pmVar4->_M_string_length,0x3d8513);
    if ((_func_void_FieldDescriptor_ptr *)local_58._0_8_ != buffer) {
      operator_delete((void *)local_58._0_8_);
    }
  }
  return;
}

Assistant:

void PrimitiveFieldGenerator::SetExtraRuntimeHasBitsBase(int has_base) {
  if (GetObjectiveCType(descriptor_) == OBJECTIVECTYPE_BOOLEAN) {
    // Set into the offset the has bit to use for the actual value.
    variables_["storage_offset_value"] = StrCat(has_base);
    variables_["storage_offset_comment"] =
        "  // Stored in _has_storage_ to save space.";
  }
}